

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

Pattern * __thiscall
trieste::detail::Pattern::operator++(Pattern *__return_storage_ptr__,Pattern *this,int param_1)

{
  element_type *peVar1;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  PatternPtr result;
  undefined1 local_129;
  Rep *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  PatternPtr local_118;
  PatternPtr local_108;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  FastPattern local_e8;
  FastPattern local_80;
  
  peVar1 = (this->pattern).
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_PatternDef[2])(&local_f8,peVar1,CONCAT44(in_register_00000014,param_1));
  if (local_f8 == (element_type *)0x0) {
    local_128 = (Rep *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<trieste::detail::Rep,std::allocator<trieste::detail::Rep>,std::shared_ptr<trieste::detail::PatternDef>const&>
              (&_Stack_120,&local_128,(allocator<trieste::detail::Rep> *)&local_129,
               (shared_ptr<trieste::detail::PatternDef> *)this);
    local_118.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_128->super_PatternDef;
    local_118.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_120._M_pi;
    local_128 = (Rep *)0x0;
    _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    FastPattern::match_opt(&local_e8,&this->fast_pattern);
    Pattern(__return_storage_ptr__,&local_118,&local_e8);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree(&local_e8.parents._M_t);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                 *)&local_e8);
    this_00._M_pi = _Stack_120._M_pi;
    if (local_118.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.
                 super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00._M_pi = _Stack_120._M_pi;
    }
  }
  else {
    local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_f8;
    local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_f0;
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
      }
    }
    FastPattern::match_any();
    Pattern(__return_storage_ptr__,&local_108,&local_80);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree(&local_80.parents._M_t);
    CLI::std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                 *)&local_80);
    this_00._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

Pattern operator++(int) const
      {
        auto result = pattern->custom_rep();
        if (result)
          // With a custom rep many things can happen.  We overapproximate here.
          // We could do better, but it's not worth the effort.
          return {result, FastPattern::match_any()};

        return {
          std::make_shared<Rep>(pattern), FastPattern::match_opt(fast_pattern)};
      }